

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profile-table.cc
# Opt level: O0

void __thiscall HeapProfileTable::SaveProfile(HeapProfileTable *this,GenericWriter *writer)

{
  Bucket *local_28;
  Bucket *curr;
  int i;
  int bucket_count;
  GenericWriter *writer_local;
  HeapProfileTable *this_local;
  
  tcmalloc::GenericWriter::AppendStr(writer,"heap profile: ");
  UnparseBucket(&this->total_,writer," heapprofile");
  for (curr._0_4_ = 0; (int)curr < 179999; curr._0_4_ = (int)curr + 1) {
    for (local_28 = this->bucket_table_[(int)curr]; local_28 != (Bucket *)0x0;
        local_28 = local_28->next) {
      UnparseBucket(local_28,writer,"");
    }
  }
  tcmalloc::GenericWriter::AppendStr(writer,"\nMAPPED_LIBRARIES:\n");
  tcmalloc::SaveProcSelfMaps(writer);
  return;
}

Assistant:

void HeapProfileTable::SaveProfile(tcmalloc::GenericWriter* writer) const {
  writer->AppendStr(kProfileHeader);
  UnparseBucket(total_, writer, " heapprofile");

  int bucket_count = 0;
  for (int i = 0; i < kHashTableSize; i++) {
    for (Bucket* curr = bucket_table_[i]; curr != nullptr; curr = curr->next) {
      UnparseBucket(*curr, writer, "");
      bucket_count++;
    }
  }
  RAW_DCHECK(bucket_count == num_buckets_, "");
  (void)bucket_count;

  writer->AppendStr(kProcSelfMapsHeader);
  tcmalloc::SaveProcSelfMaps(writer);
}